

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void searchtest(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  double *x;
  myarima_object object;
  ulong uVar3;
  undefined1 local_25a8 [8];
  double temp [1200];
  
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      iVar1 = 0;
      uVar3 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",local_25a8 + uVar3);
        iVar2 = feof(__stream);
        uVar3 = uVar3 + 8;
        iVar1 = iVar1 + 1;
      } while (iVar2 == 0);
      x = (double *)malloc(uVar3 & 0x7fffffff8);
      memcpy(x,local_25a8,uVar3 & 0x7fffffff8);
    }
    else {
      iVar1 = 0;
      x = (double *)malloc(0);
    }
    object = search_arima(x,iVar1,1,0,1,1,0,0,5,0,0,"aic",0,(double *)0x0,0,0.0,0,1,0,0);
    printf("ic %g \n",object->ic);
    free(x);
    myarima_free(object);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void searchtest() {
	int i,j,p_max,q_max,P_max,Q_max,Order_max,d,D,s,stationary;
	myarima_object obj;
	double *inp,*xreg;
	int N,r = 0;
	const char *ic = "aic";
	int approximation = 0;
	double offset = 0;
	int allowdrift,allowmean,method;

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * r);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}
	d = 1;
	D = 0;
	s = 0;
	P_max = 0;
	Q_max = 0;
	p_max = 1;
	q_max = 1;
	Order_max = 5;
	stationary = 0;
	allowdrift = 0;
	allowmean = 1;
	method = 0;

	obj = search_arima(inp,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,approximation, NULL,r,offset,allowdrift,allowmean,0,method);

	printf("ic %g \n",obj->ic);

	free(inp);
	free(xreg);
	myarima_free(obj);
}